

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::objectivec::FieldName_abi_cxx11_(FieldDescriptor *field)

{
  undefined1 uVar1;
  byte bVar2;
  string *in_RDI;
  string result;
  string name;
  FieldDescriptor *in_stack_fffffffffffffef0;
  allocator *paVar3;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  undefined6 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0e;
  string *str;
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [32];
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  string local_30 [7];
  undefined1 in_stack_ffffffffffffffd7;
  string *in_stack_ffffffffffffffd8;
  
  str = in_RDI;
  (anonymous_namespace)::NameFromFieldDescriptor_abi_cxx11_
            ((FieldDescriptor *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  anon_unknown_0::UnderscoresToCamelCase(in_stack_ffffffffffffffd8,(bool)in_stack_ffffffffffffffd7);
  uVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x497fa1);
  if ((!(bool)uVar1) ||
     (in_stack_ffffffffffffff0e = FieldDescriptor::is_map(in_stack_fffffffffffffef0),
     (bool)in_stack_ffffffffffffff0e)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"Array",&local_81);
    bVar2 = HasSuffixString(str,(string *)
                                CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff0e,
                                                        in_stack_ffffffffffffff08)));
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    if ((bVar2 & 1) != 0) {
      std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffb0,"_p");
    }
  }
  else {
    std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffb0,"Array");
  }
  paVar3 = &local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"",paVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"_p",&local_d1);
  anon_unknown_0::SanitizeNameForObjC
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

string FieldName(const FieldDescriptor* field) {
  const string name = NameFromFieldDescriptor(field);
  string result = UnderscoresToCamelCase(name, false);
  if (field->is_repeated() && !field->is_map()) {
    // Add "Array" before do check for reserved worlds.
    result += "Array";
  } else {
    // If it wasn't repeated, but ends in "Array", force on the _p suffix.
    if (HasSuffixString(result, "Array")) {
      result += "_p";
    }
  }
  return SanitizeNameForObjC("", result, "_p", NULL);
}